

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.cpp
# Opt level: O0

void __thiscall
Js::RecyclableObject::RecyclableObject
          (RecyclableObject *this,DynamicType *type,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  TypeId TVar3;
  undefined4 *puVar4;
  ScriptContext *scriptContext_local;
  DynamicType *type_local;
  RecyclableObject *this_local;
  
  FinalizableObject::FinalizableObject(&this->super_FinalizableObject);
  (this->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01e49508;
  Memory::WriteBarrierPtr<Js::Type>::WriteBarrierPtr(&this->type,&type->super_Type);
  TVar3 = Js::Type::GetTypeId(&type->super_Type);
  if (TVar3 != TypeIds_GlobalObject) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/RecyclableObject.cpp"
                                ,0x7b,"(type->GetTypeId() == TypeIds_GlobalObject)",
                                "type->GetTypeId() == TypeIds_GlobalObject");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  RecordAllocation(this,scriptContext);
  return;
}

Assistant:

RecyclableObject::RecyclableObject(DynamicType * type, ScriptContext * scriptContext) : type(type)
    {
#if DBG_EXTRAFIELD
        dtorCalled = false;
#ifdef HEAP_ENUMERATION_VALIDATION
        m_heapEnumValidationCookie = 0;
#endif
#endif
        Assert(type->GetTypeId() == TypeIds_GlobalObject);
        RecordAllocation(scriptContext);
    }